

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  ostream *poVar2;
  reference pvVar3;
  reference pvVar4;
  undefined8 *in_RSI;
  int in_EDI;
  int i;
  int batches;
  vector<int,_std::allocator<int>_> file_label;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file_name;
  FileList files;
  int in_stack_00002604;
  vector<int,_std::allocator<int>_> *in_stack_00002608;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00002610;
  FileList *in_stack_00002618;
  FileList *in_stack_fffffffffffffea0;
  ostream *in_stack_fffffffffffffeb0;
  int local_110;
  vector<int,_std::allocator<int>_> local_108;
  string *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  FileList *in_stack_ffffffffffffff20;
  allocator local_d1;
  string local_d0 [55];
  allocator local_99;
  string local_98 [136];
  undefined8 *local_10;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  if (in_EDI == 3) {
    pcVar1 = (char *)in_RSI[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,pcVar1,&local_99);
    pcVar1 = (char *)local_10[2];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,pcVar1,&local_d1);
    flst::FileList::FileList
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1085e9);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1085f8);
    flst::FileList::nextBatch
              (in_stack_00002618,in_stack_00002610,in_stack_00002608,in_stack_00002604);
    for (local_110 = 0; local_110 < 0x40; local_110 = local_110 + 1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"label:");
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_108,(long)local_110);
      in_stack_fffffffffffffeb0 = (ostream *)std::ostream::operator<<(poVar2,*pvVar3);
      poVar2 = std::operator<<(in_stack_fffffffffffffeb0,"\tfile_name:");
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&stack0xffffffffffffff10,(long)local_110);
      in_stack_fffffffffffffea0 = (FileList *)std::operator<<(poVar2,(string *)pvVar4);
      std::ostream::operator<<
                ((ostream *)in_stack_fffffffffffffea0,std::endl<char,std::char_traits<char>>);
    }
    local_4 = 0;
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffeb0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffeb0);
    flst::FileList::~FileList(in_stack_fffffffffffffea0);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Useage: ");
    poVar2 = std::operator<<(poVar2,(char *)*local_10);
    poVar2 = std::operator<<(poVar2,"file_dir file_type[eg: .jpg]");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int main(int argc, char *argv[])
{
    if(argc != 3)
    {
        std::cerr << "Useage: " << argv[0] << "file_dir file_type[eg: .jpg]" << std::endl;
        return -1;
    }
    flst::FileList files(argv[1], argv[2]);
    std::vector<std::string> file_name;
    std::vector<int> file_label;
    int batches = 64;

    files.nextBatch(file_name, file_label, batches);

    for(int i = 0; i < batches; i++)
    {
        std::cout << "label:" << file_label[i] << "\tfile_name:" << file_name[i] << std::endl;
    }

    return 0;
}